

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjoint_sets.cpp
# Opt level: O2

void __thiscall
geometrycentral::MarkedDisjointSets::MarkedDisjointSets(MarkedDisjointSets *this,size_t n_)

{
  size_t i;
  ulong __n;
  reference rVar1;
  allocator_type local_2b;
  allocator_type local_2a;
  allocator_type local_29;
  
  this->n = n_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->parent,n_ + 1,&local_29)
  ;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->rank,this->n + 1,&local_2a);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->marked,this->n + 1,&local_2b);
  for (__n = 0; __n <= this->n; __n = __n + 1) {
    (this->rank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[__n] = 0;
    (this->parent).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[__n] = __n;
    rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->marked,__n);
    *rVar1._M_p = *rVar1._M_p & ~rVar1._M_mask;
  }
  return;
}

Assistant:

MarkedDisjointSets::MarkedDisjointSets(size_t n_) : n(n_), parent(n + 1), rank(n + 1), marked(n + 1) {
  // Initialize all elements to be in different sets and to have rank 0
  for (size_t i = 0; i <= n; i++) {
    rank[i] = 0;
    parent[i] = i;
    marked[i] = false;
  }
}